

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

void __thiscall banksia::ChessBoard::checkEnpassant(ChessBoard *this)

{
  ChessBoard *this_local;
  
  if (((this->enpassant < 0x10) || (0x17 < this->enpassant)) &&
     ((this->enpassant < 0x28 || (0x2f < this->enpassant)))) {
    this->enpassant = -1;
  }
  return;
}

Assistant:

void ChessBoard::checkEnpassant() {
    if ((enpassant >= 16 && enpassant < 24) || (enpassant >= 40 && enpassant < 48))  {
        return;
    }
    enpassant = -1;
}